

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msp430cpu.cpp
# Opt level: O2

int16_t __thiscall MSP430Cpu::bcd2bin(MSP430Cpu *this,int16_t data,bool is8Bit)

{
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,is8Bit) != 0) {
    return (short)(((ulong)(ushort)data & 0xff) >> 4) * -6 + (short)((ulong)(ushort)data & 0xff);
  }
  return (data & 0xfU) + (short)((uint)(int)data >> 0xc) * 1000 +
         ((short)(char)((ushort)data >> 8) & 0xfU) * 100 +
         ((ushort)((uint)(int)data >> 4) & 0xf) * 10;
}

Assistant:

int16_t MSP430Cpu::bcd2bin(int16_t data, bool is8Bit)
{
    int16_t result = 0;
    if (is8Bit) {
        data &= 0xff;
        result = (data >> 4) * 10 + (data & 0xf);
    } else {
        result = (data >> 12) * 1000 +
                 ((data >> 8) & 0xf) * 100 +
                 ((data >> 4) & 0xf) * 10 +
                 (data & 0xf);
    }
    return result;
}